

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O0

void * duckdb_je_large_palloc(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  uint uVar4;
  ulong uVar5;
  edata_t *item;
  ulong in_RCX;
  arena_t *in_RDX;
  arena_t *in_RSI;
  long in_RDI;
  byte in_R8B;
  _Bool idump;
  edata_t *edata;
  size_t ausize;
  size_t usize_1;
  size_t threshold;
  arena_t *tsd_arena;
  size_t ret_3;
  size_t ret;
  size_t usize_3;
  size_t delta_mask_1;
  size_t delta_1;
  size_t lg_delta_1;
  size_t x_1;
  size_t lg_ceil_1;
  size_t lg_tmin_1;
  size_t usize_2;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  size_t ret_2;
  size_t ret_5;
  szind_t ret_1;
  szind_t ret_4;
  size_t result;
  uint8_t state;
  uint64_t *prng_state;
  ticker_geom_t *decay_ticker;
  tsd_t *tsd;
  uint8_t state_3;
  uint8_t state_1;
  uint8_t state_2;
  undefined4 in_stack_fffffffffffffcf8;
  int32_t in_stack_fffffffffffffcfc;
  tsd_t *in_stack_fffffffffffffd00;
  ticker_geom_t *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 uVar6;
  tsdn_t *in_stack_fffffffffffffd18;
  arena_t *local_2e0;
  arena_t *local_2d0;
  undefined7 in_stack_fffffffffffffd50;
  ulong usize_00;
  arena_t *paVar7;
  arena_t *arena_00;
  void *local_288;
  arena_t *local_280;
  arena_t *local_268;
  arena_t *local_250;
  arena_t *local_208;
  arena_t *local_1f8;
  arena_t *local_198;
  arena_t *local_190;
  ulong local_150;
  arena_t *local_148;
  
  bVar1 = in_R8B & 1;
  usize_00 = in_RCX;
  paVar7 = in_RDX;
  local_250 = in_RSI;
  if ((in_RDX < (arena_t *)0x3801) && (in_RCX < 0x1001)) {
    local_150 = (long)in_RDX->nthreads + (in_RCX - 1) & (in_RCX ^ 0xffffffffffffffff) + 1;
    if (local_150 < 0x1001) {
      local_208 = (arena_t *)
                  duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[local_150 + 7 >> 3]];
    }
    else {
      if (local_150 < 0x7000000000000001) {
        if (local_150 == 0) {
          local_150 = 1;
        }
        if (local_150 < 9) {
          pow2_ceil_zu(0x2539015);
          uVar4 = lg_floor(0x253901d);
          if (uVar4 < 3) {
            bVar2 = 3;
          }
          else {
            bVar2 = (byte)uVar4 & 0x3f;
          }
          local_2d0 = (arena_t *)(1L << bVar2);
          local_148 = local_2d0;
        }
        else {
          uVar4 = lg_floor(0x253908b);
          if (uVar4 < 7) {
            bVar2 = 4;
          }
          else {
            bVar2 = (char)uVar4 - 3;
          }
          uVar5 = (1L << (bVar2 & 0x3f)) - 1;
          local_148 = (arena_t *)(local_150 + uVar5 & (uVar5 ^ 0xffffffffffffffff));
        }
      }
      else {
        local_148 = (arena_t *)0x0;
      }
      local_208 = local_148;
      local_250 = in_RSI;
    }
    if (local_208 < (arena_t *)0x4000) {
      local_268 = local_208;
      goto LAB_025394d2;
    }
  }
  if (in_RCX < 0x7000000000000001) {
    if (in_RDX < (arena_t *)0x4001) {
      local_280 = (arena_t *)0x4000;
    }
    else {
      if (in_RDX < (arena_t *)0x1001) {
        local_1f8 = (arena_t *)
                    duckdb_je_sz_index2size_tab
                    [duckdb_je_sz_size2index_tab[(ulong)((long)&in_RDX->nthreads[1].repr + 3U) >> 3]
                    ];
      }
      else {
        if (in_RDX < (arena_t *)0x7000000000000001) {
          local_198 = in_RDX;
          if (in_RDX == (arena_t *)0x0) {
            local_198 = (arena_t *)0x1;
          }
          if (local_198 < (arena_t *)0x9) {
            pow2_ceil_zu(0x253931b);
            uVar4 = lg_floor(0x2539323);
            if (uVar4 < 3) {
              bVar2 = 3;
            }
            else {
              bVar2 = (byte)uVar4 & 0x3f;
            }
            local_2e0 = (arena_t *)(1L << bVar2);
            local_190 = local_2e0;
          }
          else {
            uVar4 = lg_floor(0x2539391);
            if ((ulong)uVar4 < 7) {
              in_stack_fffffffffffffd18 = (tsdn_t *)0x4;
            }
            else {
              in_stack_fffffffffffffd18 = (tsdn_t *)((ulong)uVar4 - 3);
            }
            uVar5 = (1L << ((byte)in_stack_fffffffffffffd18 & 0x3f)) - 1;
            local_190 = (arena_t *)
                        ((long)local_198->nthreads + uVar5 & (uVar5 ^ 0xffffffffffffffff));
          }
        }
        else {
          local_190 = (arena_t *)0x0;
        }
        local_1f8 = local_190;
      }
      local_280 = local_1f8;
      if (local_1f8 < in_RDX) {
        local_268 = (arena_t *)0x0;
        goto LAB_025394d2;
      }
    }
    if ((arena_t *)
        ((long)local_280 + (in_RCX + 0xfff & 0xfffffffffffff000) + duckdb_je_sz_large_pad + -0x1000)
        < local_280) {
      local_268 = (arena_t *)0x0;
    }
    else {
      local_268 = local_280;
    }
  }
  else {
    local_268 = (arena_t *)0x0;
  }
LAB_025394d2:
  uVar6 = local_268 == (arena_t *)0x0 || (arena_t *)0x7000000000000000 < local_268;
  if (local_268 == (arena_t *)0x0 || (arena_t *)0x7000000000000000 < local_268) {
    local_288 = (void *)0x0;
  }
  else {
    arena_00 = paVar7;
    if ((in_RDI != 0) && (local_250 == (arena_t *)0x0)) {
      local_250 = *(arena_t **)(in_RDI + 0x90);
      if (local_250 == (arena_t *)0x0) {
        local_250 = arena_choose(in_stack_fffffffffffffd00,
                                 (arena_t *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      }
      in_stack_fffffffffffffd00 = (tsd_t *)&(local_250->pa_shard).pac.duckdb_je_oversize_threshold;
      in_stack_fffffffffffffd08 = (ticker_geom_t *)0x0;
      in_stack_fffffffffffffcfc = 0;
      if (((arena_t *)((atomic_zu_t *)in_stack_fffffffffffffd00)->repr <= paVar7) &&
         (_Var3 = arena_is_auto((arena_t *)&UNK_02539767), _Var3)) {
        local_250 = duckdb_je_arena_choose_huge
                              ((tsd_t *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
      }
    }
    if ((local_250 == (arena_t *)0x0) ||
       (item = duckdb_je_arena_extent_alloc_large
                         ((tsdn_t *)local_250,arena_00,usize_00,
                          CONCAT17(bVar1,in_stack_fffffffffffffd50),
                          SUB81((ulong)local_268 >> 0x38,0)), item == (edata_t *)0x0)) {
      local_288 = (void *)0x0;
    }
    else {
      _Var3 = arena_is_auto((arena_t *)0x2539804);
      if (!_Var3) {
        malloc_mutex_lock(in_stack_fffffffffffffd18,
                          (malloc_mutex_t *)CONCAT17(uVar6,in_stack_fffffffffffffd10));
        edata_list_active_append(&local_250->large,item);
        malloc_mutex_unlock((tsdn_t *)CONCAT17(uVar6,in_stack_fffffffffffffd10),
                            (malloc_mutex_t *)in_stack_fffffffffffffd08);
      }
      if ((in_RDI != 0) &&
         (_Var3 = ticker_geom_ticks(in_stack_fffffffffffffd08,(uint64_t *)in_stack_fffffffffffffd00,
                                    in_stack_fffffffffffffcfc,
                                    SUB41((uint)in_stack_fffffffffffffcf8 >> 0x18,0)), _Var3)) {
        duckdb_je_arena_decay
                  ((tsdn_t *)in_stack_fffffffffffffd00,
                   (arena_t *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),false,
                   false);
      }
      local_288 = edata_addr_get(item);
    }
  }
  return local_288;
}

Assistant:

void *
large_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero) {
	size_t ausize;
	edata_t *edata;
	UNUSED bool idump JEMALLOC_CC_SILENCE_INIT(false);

	assert(!tsdn_null(tsdn) || arena != NULL);

	ausize = sz_sa2u(usize, alignment);
	if (unlikely(ausize == 0 || ausize > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, usize);
	}
	if (unlikely(arena == NULL) || (edata = arena_extent_alloc_large(tsdn,
	    arena, usize, alignment, zero)) == NULL) {
		return NULL;
	}

	/* See comments in arena_bin_slabs_full_insert(). */
	if (!arena_is_auto(arena)) {
		/* Insert edata into large. */
		malloc_mutex_lock(tsdn, &arena->large_mtx);
		edata_list_active_append(&arena->large, edata);
		malloc_mutex_unlock(tsdn, &arena->large_mtx);
	}

	arena_decay_tick(tsdn, arena);
	return edata_addr_get(edata);
}